

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

LR des_inner_cipher(LR lr,des_keysched *sched,size_t start,size_t step)

{
  LR LVar1;
  size_t step_local;
  size_t start_local;
  des_keysched *sched_local;
  LR lr_local;
  
  LVar1 = des_round(lr,sched,start);
  LVar1 = des_round(LVar1,sched,start + step);
  LVar1 = des_round(LVar1,sched,start + step * 2);
  LVar1 = des_round(LVar1,sched,start + step * 3);
  LVar1 = des_round(LVar1,sched,start + step * 4);
  LVar1 = des_round(LVar1,sched,start + step * 5);
  LVar1 = des_round(LVar1,sched,start + step * 6);
  LVar1 = des_round(LVar1,sched,start + step * 7);
  LVar1 = des_round(LVar1,sched,start + step * 8);
  LVar1 = des_round(LVar1,sched,start + step * 9);
  LVar1 = des_round(LVar1,sched,start + step * 10);
  LVar1 = des_round(LVar1,sched,start + step * 0xb);
  LVar1 = des_round(LVar1,sched,start + step * 0xc);
  LVar1 = des_round(LVar1,sched,start + step * 0xd);
  LVar1 = des_round(LVar1,sched,start + step * 0xe);
  LVar1 = des_round(LVar1,sched,start + step * 0xf);
  LVar1 = des_swap_lr(LVar1);
  return LVar1;
}

Assistant:

static inline LR des_inner_cipher(LR lr, const des_keysched *sched,
                                  size_t start, size_t step)
{
    lr = des_round(lr, sched, start+0x0*step);
    lr = des_round(lr, sched, start+0x1*step);
    lr = des_round(lr, sched, start+0x2*step);
    lr = des_round(lr, sched, start+0x3*step);
    lr = des_round(lr, sched, start+0x4*step);
    lr = des_round(lr, sched, start+0x5*step);
    lr = des_round(lr, sched, start+0x6*step);
    lr = des_round(lr, sched, start+0x7*step);
    lr = des_round(lr, sched, start+0x8*step);
    lr = des_round(lr, sched, start+0x9*step);
    lr = des_round(lr, sched, start+0xa*step);
    lr = des_round(lr, sched, start+0xb*step);
    lr = des_round(lr, sched, start+0xc*step);
    lr = des_round(lr, sched, start+0xd*step);
    lr = des_round(lr, sched, start+0xe*step);
    lr = des_round(lr, sched, start+0xf*step);
    return des_swap_lr(lr);
}